

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O1

string_view
gmlc::utilities::string_viewOps::getTailString_any
          (string_view input,string_view separationCharacters)

{
  string_view sVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = input._M_str;
  local_10._M_len = input._M_len;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    (&local_10,separationCharacters._M_str,0xffffffffffffffff,
                     separationCharacters._M_len);
  if (sVar2 != 0xffffffffffffffff) {
    local_10._M_str = local_10._M_str + sVar2 + 1;
    local_10._M_len = local_10._M_len - (sVar2 + 1);
  }
  sVar1._M_str = local_10._M_str;
  sVar1._M_len = local_10._M_len;
  return sVar1;
}

Assistant:

std::string_view getTailString_any(
    std::string_view input,
    std::string_view separationCharacters) noexcept
{
    auto sepLoc = input.find_last_of(separationCharacters);
    if (sepLoc != std::string_view::npos) {
        input.remove_prefix(sepLoc + 1);
    }
    return input;
}